

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

bool google::protobuf::internal::ReflectionOps::IsInitialized(Message *message)

{
  pointer ppFVar1;
  bool bVar2;
  int iVar3;
  Reflection *this;
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  FieldDescriptor *pFVar6;
  MapFieldBase *this_00;
  MessageLite *pMVar7;
  int iVar8;
  pointer ppFVar9;
  Metadata MVar10;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  
  MVar10 = Message::GetMetadata(message);
  pDVar5 = MVar10.descriptor;
  this = GetReflectionOrDie(message);
  iVar3 = pDVar5->field_count_;
  iVar8 = 0;
  if (iVar3 < 1) {
    iVar3 = 0;
    iVar8 = 0;
  }
  for (; iVar3 != iVar8; iVar8 = iVar8 + 1) {
    pFVar4 = Descriptor::field(pDVar5,iVar8);
    bVar2 = FieldDescriptor::is_required(pFVar4);
    if (bVar2) {
      pFVar4 = Descriptor::field(pDVar5,iVar8);
      bVar2 = Reflection::HasField(this,message,pFVar4);
      if (!bVar2) {
        return false;
      }
    }
  }
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  if ((pDVar5->options_->field_0)._impl_.map_entry_ == true) {
    iter.iter_.node_ = (NodeBase *)Descriptor::map_value(pDVar5);
    std::
    vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
    ::_M_assign_aux<google::protobuf::FieldDescriptor_const*const*>
              ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                *)&fields,&iter);
    ppFVar9 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    Reflection::ListFields(this,message,&fields);
    ppFVar9 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppFVar1 = fields.
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppFVar9 != ppFVar1; ppFVar9 = ppFVar9 + 1) {
    pFVar4 = *ppFVar9;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar4->type_ * 4) == 10) {
      bVar2 = FieldDescriptor::is_map(pFVar4);
      if (bVar2) {
        pDVar5 = FieldDescriptor::message_type(pFVar4);
        pFVar6 = Descriptor::field(pDVar5,1);
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar6->type_ * 4) == 10) {
          this_00 = Reflection::GetMapData(this,message,pFVar4);
          bVar2 = MapFieldBase::IsMapValid(this_00);
          if (!bVar2) goto LAB_002c1344;
          MapIterator::MapIterator(&iter,message,pFVar4);
          MapIterator::MapIterator(&end,message,pFVar4);
          MapFieldBase::MapBegin(this_00,&iter);
          MapFieldBase::MapEnd(this_00,&end);
          while (bVar2 = protobuf::operator!=(&iter,&end), bVar2) {
            pMVar7 = &MapValueConstRef::GetMessageValue(&iter.value_.super_MapValueConstRef)->
                      super_MessageLite;
            bVar2 = MessageLite::IsInitialized(pMVar7);
            if (!bVar2) {
              MapKey::~MapKey(&end.key_);
              MapKey::~MapKey(&iter.key_);
              goto LAB_002c13ea;
            }
            MapIterator::operator++(&iter);
          }
          MapKey::~MapKey(&end.key_);
          MapKey::~MapKey(&iter.key_);
        }
      }
      else {
LAB_002c1344:
        bVar2 = FieldDescriptor::is_repeated(pFVar4);
        if (bVar2) {
          iVar3 = Reflection::FieldSize(this,message,pFVar4);
          iVar8 = 0;
          if (iVar3 < 1) {
            iVar3 = iVar8;
          }
          while (iVar3 != iVar8) {
            pMVar7 = &Reflection::GetRepeatedMessage(this,message,pFVar4,iVar8)->super_MessageLite;
            bVar2 = MessageLite::IsInitialized(pMVar7);
            iVar8 = iVar8 + 1;
            if (!bVar2) goto LAB_002c13ea;
          }
        }
        else {
          pMVar7 = &Reflection::GetMessage(this,message,pFVar4,(MessageFactory *)0x0)->
                    super_MessageLite;
          bVar2 = MessageLite::IsInitialized(pMVar7);
          if (!bVar2) break;
        }
      }
    }
  }
LAB_002c13ea:
  std::
  _Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~_Vector_base(&fields.
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 );
  return ppFVar9 == ppFVar1;
}

Assistant:

bool ReflectionOps::IsInitialized(const Message& message) {
  const Descriptor* descriptor = message.GetDescriptor();
  const Reflection* reflection = GetReflectionOrDie(message);

  // Check required fields of this message.
  {
    const int field_count = descriptor->field_count();
    for (int i = 0; i < field_count; i++) {
      if (descriptor->field(i)->is_required()) {
        if (!reflection->HasField(message, descriptor->field(i))) {
          return false;
        }
      }
    }
  }

  // Check that sub-messages are initialized.
  std::vector<const FieldDescriptor*> fields;
  // Should be safe to skip stripped fields because required fields are not
  // stripped.
  if (descriptor->options().map_entry()) {
    // MapEntry objects always check the value regardless of has bit.
    // We don't need to bother with the key.
    fields = {descriptor->map_value()};
  } else {
    reflection->ListFields(message, &fields);
  }
  for (const FieldDescriptor* field : fields) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {

      if (field->is_map()) {
        const FieldDescriptor* value_field = field->message_type()->field(1);
        if (value_field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
          const MapFieldBase* map_field =
              reflection->GetMapData(message, field);
          if (map_field->IsMapValid()) {
            MapIterator iter(const_cast<Message*>(&message), field);
            MapIterator end(const_cast<Message*>(&message), field);
            for (map_field->MapBegin(&iter), map_field->MapEnd(&end);
                 iter != end; ++iter) {
              if (!iter.GetValueRef().GetMessageValue().IsInitialized()) {
                return false;
              }
            }
            continue;
          }
        } else {
          continue;
        }
      }

      if (field->is_repeated()) {
        int size = reflection->FieldSize(message, field);

        for (int j = 0; j < size; j++) {
          if (!reflection->GetRepeatedMessage(message, field, j)
                   .IsInitialized()) {
            return false;
          }
        }
      } else {
        if (!reflection->GetMessage(message, field).IsInitialized()) {
          return false;
        }
      }
    }
  }

  return true;
}